

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_range.cc
# Opt level: O0

void re2c::UTF16addContinuous1(RangeSuffix **root,uint32_t l,uint32_t h)

{
  RangeSuffix *this;
  RangeSuffix **local_20;
  RangeSuffix **p;
  uint32_t h_local;
  uint32_t l_local;
  RangeSuffix **root_local;
  
  local_20 = root;
  while( true ) {
    if (*local_20 == (RangeSuffix *)0x0) {
      this = (RangeSuffix *)operator_new(0x18);
      RangeSuffix::RangeSuffix(this,l,h);
      *local_20 = this;
      return;
    }
    if (((*local_20)->l == l) && ((*local_20)->h == h)) break;
    local_20 = &(*local_20)->next;
  }
  return;
}

Assistant:

void UTF16addContinuous1(RangeSuffix * & root, uint32_t l, uint32_t h)
{
	RangeSuffix ** p = &root;
	for (;;)
	{
		if (*p == NULL)
		{
			*p = new RangeSuffix(l, h);
			break;
		}
		else if ((*p)->l == l && (*p)->h == h)
		{
			break;
		}
		else
			p = &(*p)->next;
	}
}